

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O2

ggml_tensor * __thiscall llm_graph_context::build_inp_mean(llm_graph_context *this)

{
  ggml_tensor *pgVar1;
  llm_graph_input_i *plVar2;
  _func_int **pp_Var3;
  _Head_base<0UL,_llm_graph_input_i_*,_false> local_20;
  llm_graph_input_i *local_18;
  
  std::make_unique<llm_graph_input_mean,llama_cparams_const&>((llama_cparams *)&local_18);
  plVar2 = local_18;
  pp_Var3 = (_func_int **)ggml_new_tensor_2d(this->ctx0,0,(long)this->n_tokens);
  plVar2[1]._vptr_llm_graph_input_i = pp_Var3;
  ggml_set_input(pp_Var3);
  local_20._M_head_impl = local_18;
  local_18 = (llm_graph_input_i *)0x0;
  llm_graph_result::add_input
            ((this->res)._M_t.
             super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
             super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
             super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl,
             (llm_graph_input_ptr *)&local_20);
  if (local_20._M_head_impl != (llm_graph_input_i *)0x0) {
    (*(local_20._M_head_impl)->_vptr_llm_graph_input_i[1])();
  }
  local_20._M_head_impl = (llm_graph_input_i *)0x0;
  pgVar1 = (ggml_tensor *)plVar2[1]._vptr_llm_graph_input_i;
  if (local_18 != (llm_graph_input_i *)0x0) {
    (**(code **)(*(long *)local_18 + 8))();
  }
  return pgVar1;
}

Assistant:

ggml_tensor * llm_graph_context::build_inp_mean() const {
    auto inp = std::make_unique<llm_graph_input_mean>(cparams);

    auto & cur = inp->mean;

    cur = ggml_new_tensor_2d(ctx0, GGML_TYPE_F32, n_tokens, n_tokens);
    ggml_set_input(cur);

    res->add_input(std::move(inp));

    return cur;
}